

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

void __thiscall wasm::I64ToI32Lowering::I64ToI32Lowering(I64ToI32Lowering *this)

{
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
  ).super_Pass.runner = (PassRunner *)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
  ).super_Pass.name._M_dataplus._M_p =
       (pointer)&(this->
                 super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                 ).super_Pass.name.field_2;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
  ).super_Pass.name._M_string_length = 0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
  ).super_Pass.name.field_2._M_local_buf[0] = '\0';
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
  ).super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.replacep =
       (Expression **)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
  ).super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.stack.usedFixed
       = 0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
  ).super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::Task,_std::allocator<wasm::Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->
           super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
           ).super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
           super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.stack.
           flexible.
           super__Vector_base<wasm::Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::Task,_std::allocator<wasm::Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::Task>_>
           ._M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->
           super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
           ).super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
           super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.stack.
           flexible.
           super__Vector_base<wasm::Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::Task,_std::allocator<wasm::Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::Task>_>
           ._M_impl + 0x10) = (pointer)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
  ).super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.currFunction =
       (Function *)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
  ).super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.currModule =
       (Module *)0x0;
  (this->builder)._M_t.super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
  _M_t.super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
  super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl = (Builder *)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__I64ToI32Lowering_00e1ed68;
  (this->indexMap)._M_h._M_buckets = &(this->indexMap)._M_h._M_single_bucket;
  (this->indexMap)._M_h._M_bucket_count = 1;
  (this->indexMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->indexMap)._M_h._M_element_count = 0;
  (this->indexMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->indexMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->indexMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->freeTemps)._M_h._M_buckets = &(this->freeTemps)._M_h._M_single_bucket;
  (this->freeTemps)._M_h._M_bucket_count = 1;
  (this->freeTemps)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->freeTemps)._M_h._M_element_count = 0;
  (this->freeTemps)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->freeTemps)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->freeTemps)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->highBitVars)._M_h._M_buckets = &(this->highBitVars)._M_h._M_single_bucket;
  (this->highBitVars)._M_h._M_bucket_count = 1;
  (this->highBitVars)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->highBitVars)._M_h._M_element_count = 0;
  (this->highBitVars)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->highBitVars)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->highBitVars)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->tempTypes)._M_h._M_buckets = &(this->tempTypes)._M_h._M_single_bucket;
  (this->tempTypes)._M_h._M_bucket_count = 1;
  (this->tempTypes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tempTypes)._M_h._M_element_count = 0;
  (this->tempTypes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tempTypes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tempTypes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->originallyI64Globals)._M_h._M_buckets = &(this->originallyI64Globals)._M_h._M_single_bucket
  ;
  (this->originallyI64Globals)._M_h._M_bucket_count = 1;
  (this->originallyI64Globals)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->originallyI64Globals)._M_h._M_element_count = 0;
  (this->originallyI64Globals)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->originallyI64Globals)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->originallyI64Globals)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

TempVar(Index idx, Type ty, I64ToI32Lowering& pass)
      : idx(idx), pass(pass), moved(false), ty(ty) {}